

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O2

void write_slot(MultiPCM *ptChip,slot_t *slot,INT32 reg,UINT8 data)

{
  UINT32 *steps;
  UINT8 data_00;
  UINT8 *pUVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  UINT32 UVar5;
  UINT32 UVar6;
  INT32 IVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  do {
    slot->regs[reg] = data;
    switch(reg) {
    case 0:
      slot->pan = (uint)(data >> 4);
      return;
    case 1:
      uVar8 = (ulong)(((slot->regs[2] & 1) << 8 | (uint)slot->regs[1]) * 0xc & ptChip->ROMMask);
      pUVar1 = ptChip->ROM;
      (slot->sample).start =
           (uint)pUVar1[uVar8 + 2] | (uint)pUVar1[uVar8 + 1] << 8 | (uint)pUVar1[uVar8] << 0x10;
      (slot->sample).loop =
           ((*(ushort *)(pUVar1 + uVar8 + 3) & 0xff00) << 8 |
           (uint)*(ushort *)(pUVar1 + uVar8 + 3) << 0x18) >> 0x10;
      (slot->sample).end =
           (ushort)(*(ushort *)(pUVar1 + uVar8 + 5) << 8 | *(ushort *)(pUVar1 + uVar8 + 5) >> 8) ^
           0xffff;
      (slot->sample).attack_reg = pUVar1[uVar8 + 8] >> 4;
      (slot->sample).decay1_reg = pUVar1[uVar8 + 8] & 0xf;
      (slot->sample).decay2_reg = pUVar1[uVar8 + 9] & 0xf;
      (slot->sample).decay_level = pUVar1[uVar8 + 9] >> 4;
      (slot->sample).release_reg = pUVar1[uVar8 + 10] & 0xf;
      (slot->sample).key_rate_scale = pUVar1[uVar8 + 10] >> 4;
      data_00 = pUVar1[uVar8 + 7];
      (slot->sample).lfo_vibrato_reg = data_00;
      (slot->sample).lfo_amplitude_reg = pUVar1[uVar8 + 0xb] & 0xf;
      write_slot(ptChip,slot,6,data_00);
      data = (slot->sample).lfo_amplitude_reg;
      reg = 7;
      break;
    case 2:
    case 3:
      bVar2 = (slot->regs[3] >> 4) - 1 & 0xf;
      uVar3 = *(uint *)((long)ptChip->freq_step_table +
                       (ulong)((slot->regs[3] & 0xf) << 8 | slot->regs[2] & 0xfffffffc));
      uVar4 = uVar3 << bVar2;
      if (7 < bVar2) {
        uVar4 = uVar3 >> (0x10 - bVar2 & 0x1f);
      }
      slot->step = (UINT32)(long)((float)uVar4 / ptChip->rate);
      return;
    case 4:
      if ((char)data < '\0') {
        slot->playing = '\x01';
        uVar3 = (slot->sample).start;
        slot->base = uVar3;
        slot->offset = 0;
        slot->prev_sample = 0;
        slot->total_level = slot->dest_total_level << 0xc;
        UVar6 = 0;
        uVar4 = (uint)(slot->sample).key_rate_scale;
        if (uVar4 != 0xf) {
          uVar9 = (slot->regs[3] >> 4) - 1 & 0xf;
          uVar10 = uVar9 + 0x7ffffff0;
          if ((byte)uVar9 < 8) {
            uVar10 = uVar9;
          }
          UVar6 = (slot->regs[3] >> 3 & 1) + (uVar10 + uVar4) * 2;
        }
        UVar5 = get_rate(ptChip->attack_step,UVar6,(uint)(slot->sample).attack_reg);
        (slot->envelope_gen).attack_rate = UVar5;
        steps = ptChip->decay_release_step;
        UVar5 = get_rate(steps,UVar6,(uint)(slot->sample).decay1_reg);
        (slot->envelope_gen).decay1_rate = UVar5;
        UVar5 = get_rate(steps,UVar6,(uint)(slot->sample).decay2_reg);
        (slot->envelope_gen).decay2_rate = UVar5;
        UVar6 = get_rate(steps,UVar6,(uint)(slot->sample).release_reg);
        (slot->envelope_gen).release_rate = UVar6;
        (slot->envelope_gen).decay_level = 0xf - (uint)(slot->sample).decay_level;
        (slot->envelope_gen).volume = 0;
        (slot->envelope_gen).state = ATTACK;
        if (ptChip->sega_banking == '\0') {
          return;
        }
        slot->base = uVar3 & 0x1fffff;
        if ((uVar3 >> 0x14 & 1) == 0) {
          return;
        }
        if ((uVar3 >> 0x13 & 1) == 0) {
          uVar4 = ptChip->bank0;
        }
        else {
          uVar4 = ptChip->bank1;
        }
        slot->base = uVar3 & 0x7ffff | uVar4;
        return;
      }
      if (slot->playing == '\0') {
        return;
      }
      if ((slot->sample).release_reg == '\x0f') {
        slot->playing = '\0';
        return;
      }
      (slot->envelope_gen).state = RELEASE;
      return;
    case 5:
      uVar3 = (uint)(data >> 1);
      slot->dest_total_level = uVar3;
      if ((data & 1) == 0) {
        if (uVar3 < slot->total_level >> 0xc) {
          IVar7 = ptChip->total_level_steps[0];
        }
        else {
          IVar7 = ptChip->total_level_steps[1];
        }
        slot->total_level_step = IVar7;
        return;
      }
      slot->total_level = uVar3 << 0xc;
      return;
    case 6:
    case 7:
      if (data != 0) {
        lfo_compute_step(ptChip,&slot->pitch_lfo,slot->regs[6] >> 3 & 7,slot->regs[6] & 7,'\0');
        lfo_compute_step(ptChip,&slot->amplitude_lfo,slot->regs[6] >> 3 & 7,slot->regs[7] & 7,'\x01'
                        );
        return;
      }
    default:
      return;
    }
  } while( true );
}

Assistant:

static void write_slot(MultiPCM *ptChip, slot_t *slot, INT32 reg, UINT8 data)
{
	slot->regs[reg] = data;

	switch(reg)
	{
		case 0: // PANPOT
			slot->pan = (data >> 4) & 0xf;
			break;
		case 1: // Sample
			//according to YMF278 sample write causes some base params written to the regs (envelope+lfos)
			//the game should never change the sample while playing.
			// patched to load all sample data here, so registers 6 and 7 aren't overridden by KeyOn -Valley Bell
			init_sample(ptChip, &slot->sample, slot->regs[1] | ((slot->regs[2] & 1) << 8));
			write_slot(ptChip, slot, 6, slot->sample.lfo_vibrato_reg);
			write_slot(ptChip, slot, 7, slot->sample.lfo_amplitude_reg);
			break;
		case 2: //Pitch
		case 3:
			{
				UINT8 oct = ((slot->regs[3] >> 4) - 1) & 0xf;
				UINT32 pitch = ((slot->regs[3] & 0xf) << 6) | (slot->regs[2] >> 2);
				pitch = ptChip->freq_step_table[pitch];
				if (oct & 0x8)
					pitch >>= (16 - oct);
				else
					pitch <<= oct;
				slot->step = pitch / ptChip->rate;
			}
			break;
		case 4:     //KeyOn/Off (and more?)
			if (data & 0x80)       //KeyOn
			{
				slot->playing = 1;
				slot->base = slot->sample.start;
				slot->offset = 0;
				slot->prev_sample = 0;
				slot->total_level = slot->dest_total_level << TL_SHIFT;

				envelope_generator_calc(ptChip, slot);
				slot->envelope_gen.state = ATTACK;
				slot->envelope_gen.volume = 0;

				if (ptChip->sega_banking)
				{
					slot->base &= 0x1fffff;
					if (slot->base & 0x100000)
					{
						if (slot->base & 0x080000)
							slot->base = (slot->base & 0x07ffff) | ptChip->bank1;
						else
							slot->base = (slot->base & 0x07ffff) | ptChip->bank0;
					}
				}

			}
			else
			{
				if (slot->playing)
				{
					if (slot->sample.release_reg != 0xf)
						slot->envelope_gen.state = RELEASE;
					else
						slot->playing = 0;
				}
			}
			break;
		case 5: // TL + Interpolation
			slot->dest_total_level = (data >> 1) & 0x7f;
			if (!(data & 1))   //Interpolate TL
			{
				if ((slot->total_level >> TL_SHIFT) > slot->dest_total_level)
					slot->total_level_step = ptChip->total_level_steps[0]; // decrease
				else
					slot->total_level_step = ptChip->total_level_steps[1]; // increase
			}
			else
			{
				slot->total_level = slot->dest_total_level << TL_SHIFT;
			}
			break;
		case 6: // LFO frequency + Pitch LFO
			if (data)
			{
				lfo_compute_step(ptChip, &slot->pitch_lfo, (slot->regs[6] >> 3) & 7, slot->regs[6] & 7, 0);
				lfo_compute_step(ptChip, &slot->amplitude_lfo, (slot->regs[6] >> 3) & 7, slot->regs[7] & 7, 1);
			}
			break;
		case 7: // Amplitude LFO
			if (data)
			{
				lfo_compute_step(ptChip, &slot->pitch_lfo, (slot->regs[6] >> 3) & 7, slot->regs[6] & 7, 0);
				lfo_compute_step(ptChip, &slot->amplitude_lfo, (slot->regs[6] >> 3) & 7, slot->regs[7] & 7, 1);
			}
			break;
	}
}